

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

size_t __thiscall flexbuffers::Builder::Key(Builder *this,char *str,size_t len)

{
  pointer *ppVVar1;
  pointer puVar2;
  iterator __position;
  iterator iVar3;
  difference_type __offset;
  anon_union_8_3_83789bcb_for_Value_0 aVar4;
  size_type_conflict sloc;
  anon_union_8_3_83789bcb_for_Value_0 local_30;
  anon_union_8_3_83789bcb_for_Value_0 local_28;
  undefined8 uStack_20;
  
  puVar2 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  aVar4.i_ = (long)puVar2 -
             (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  local_30.i_ = aVar4.i_;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,puVar2,str,str + len + 1);
  local_28.i_ = aVar4.i_;
  if ((this->flags_ & BUILDER_FLAG_SHARE_KEYS) != BUILDER_FLAG_NONE) {
    iVar3 = std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
            ::find(&(this->key_pool)._M_t,&local_30.u_);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->key_pool)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,flexbuffers::Builder::KeyOffsetCompare,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,flexbuffers::Builder::KeyOffsetCompare,std::allocator<unsigned_long>>
                  *)&this->key_pool,&local_30.u_);
      local_28 = local_30;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->buf_,local_30.u_);
      local_30 = (anon_union_8_3_83789bcb_for_Value_0)
                 ((anon_union_8_3_83789bcb_for_Value_0 *)(iVar3._M_node + 1))->i_;
      local_28 = local_30;
    }
  }
  uStack_20 = 4;
  __position._M_current =
       (this->stack_).
       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stack_).
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
    _M_realloc_insert<flexbuffers::Builder::Value>(&this->stack_,__position,(Value *)&local_28);
  }
  else {
    ((__position._M_current)->field_0).u_ = (uint64_t)local_28;
    (__position._M_current)->type_ = FBT_KEY;
    (__position._M_current)->min_bit_width_ = BIT_WIDTH_8;
    ppVVar1 = &(this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
    local_30 = local_28;
  }
  return local_30.i_;
}

Assistant:

size_t Key(const char *str, size_t len) {
    auto sloc = buf_.size();
    WriteBytes(str, len + 1);
    if (flags_ & BUILDER_FLAG_SHARE_KEYS) {
      auto it = key_pool.find(sloc);
      if (it != key_pool.end()) {
        // Already in the buffer. Remove key we just serialized, and use
        // existing offset instead.
        buf_.resize(sloc);
        sloc = *it;
      } else {
        key_pool.insert(sloc);
      }
    }
    stack_.push_back(Value(static_cast<uint64_t>(sloc), FBT_KEY, BIT_WIDTH_8));
    return sloc;
  }